

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.cpp
# Opt level: O1

void __thiscall PPU::spritePixel(PPU *this,uint8_t *index,uint8_t *sprite)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((this->PPUMASK & 0x10) != 0) {
    uVar2 = (ulong)this->spriteCount;
    bVar4 = 0 < (long)uVar2;
    if (0 < (long)uVar2) {
      uVar3 = 0;
      do {
        uVar1 = ~(uint)this->spritePositions[uVar3] + this->cycle;
        if ((uVar1 < 8) &&
           (uVar1 = this->spritePatterns[uVar3] >> ((char)uVar1 * -4 + 0x1cU & 0x1f),
           (uVar1 & 3) != 0)) {
          *index = (uint8_t)uVar3;
          *sprite = (byte)uVar1 & 0xf;
          if (bVar4) {
            return;
          }
          break;
        }
        uVar3 = uVar3 + 1;
        bVar4 = uVar3 < uVar2;
      } while (uVar3 != uVar2);
    }
  }
  *index = '\0';
  *sprite = '\0';
  return;
}

Assistant:

void PPU::spritePixel(uint8_t &index, uint8_t &sprite) {
    if (!(PPUMASK & flagShowSprites)) {
        index = 0;
        sprite = 0;
        return;
    }
    for (int i = 0; i < spriteCount; i++) {
        int offset = (cycle - 1) - spritePositions[i];
        if (offset < 0 || offset > 7) {
            continue;
        }
        offset = 7 - offset;
        uint8_t color = uint8_t((spritePatterns[i] >> (offset * 4)) & 0x0F);
        if ((color % 4) == 0) {
            continue;
        }
        index = i;
        sprite = color;
        return;
    }
    index = 0;
    sprite = 0;
    return;
}